

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O0

void __thiscall duckdb::Executor::Executor(Executor *this,ClientContext *context)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  __integral_type in_stack_ffffffffffffff88;
  TaskErrorManager *this_00;
  
  *in_RDI = in_RSI;
  optional_ptr<duckdb::PhysicalOperator,_true>::optional_ptr
            ((optional_ptr<duckdb::PhysicalOperator,_true> *)(in_RDI + 1));
  unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>,_true>::
  unique_ptr((unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>,_true>
              *)0x9910bc);
  ::std::mutex::mutex((mutex *)0x9910ca);
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)0x9910dd);
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)0x9910f0);
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::vector
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)0x991103);
  unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>::
  unique_ptr((unique_ptr<duckdb::PipelineExecutor,_std::default_delete<duckdb::PipelineExecutor>,_true>
              *)0x991119);
  unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true>::unique_ptr
            ((unique_ptr<duckdb::ProducerToken,_std::default_delete<duckdb::ProducerToken>,_true> *)
             0x99112f);
  vector<duckdb::shared_ptr<duckdb::Event,_true>,_true>::vector
            ((vector<duckdb::shared_ptr<duckdb::Event,_true>,_true> *)0x991145);
  shared_ptr<duckdb::QueryProfiler,_true>::shared_ptr
            ((shared_ptr<duckdb::QueryProfiler,_true> *)0x99115b);
  this_00 = (TaskErrorManager *)(in_RDI + 0x19);
  TaskErrorManager::TaskErrorManager(this_00);
  shared_ptr<duckdb::Task,_true>::shared_ptr((shared_ptr<duckdb::Task,_true> *)0x991186);
  ::std::
  unordered_map<duckdb::Task_*,_duckdb::shared_ptr<duckdb::Task,_true>,_std::hash<duckdb::Task_*>,_std::equal_to<duckdb::Task_*>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>_>
  ::unordered_map((unordered_map<duckdb::Task_*,_duckdb::shared_ptr<duckdb::Task,_true>,_std::hash<duckdb::Task_*>,_std::equal_to<duckdb::Task_*>,_std::allocator<std::pair<duckdb::Task_*const,_duckdb::shared_ptr<duckdb::Task,_true>_>_>_>
                   *)0x991199);
  ::std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x2e));
  ::std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)this_00,in_stack_ffffffffffffff88);
  ::std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)this_00,in_stack_ffffffffffffff88);
  return;
}

Assistant:

Executor::Executor(ClientContext &context) : context(context), executor_tasks(0), blocked_thread_time(0) {
}